

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

ProString * __thiscall
ProString::operator=
          (ProString *this,
          QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]> *str)

{
  ProString *pPVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  ProString local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>::
  convertTo<QString>((QString *)&QStack_68,str);
  ProString(&local_50,(QString *)&QStack_68);
  pPVar1 = operator=(this,&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pPVar1;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator=(const QStringBuilder<A, B> &str)
    { return *this = QString(str); }